

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iirdemo.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  double dVar1;
  double b_6;
  double a_6;
  int i_6;
  SOSCascade<3,_Iir::DirectFormII> cust2;
  int nSOS2;
  double coeff2 [3] [6];
  double b_5;
  double a_5;
  int i_5;
  SOSCascade<2,_Iir::DirectFormII> cust;
  int nSOS;
  double coeff [2] [6];
  double b_4;
  double a_4;
  int i_4;
  double norm_frequency_width;
  double norm_center_frequency;
  BandStop<4,_Iir::DirectFormII> bsn;
  double b_3;
  double a_3;
  int i_3;
  double normalised_cutoff_freq;
  double stop_ripple_dB;
  HighPass<8,_Iir::DirectFormII> hp_cheby2;
  double b_2;
  double a_2;
  int i_2;
  float pass_ripple_db2;
  LowPass<8,_Iir::DirectFormII> lp_cheby1;
  double b_1;
  double a_1;
  int i_1;
  double hp_qfactor;
  double hp_cutoff_frequency;
  HighPass hp;
  complex_t r;
  double fr;
  FILE *fresp;
  double b;
  double a;
  int i;
  double cutoff_frequency;
  LowPass<8,_Iir::DirectFormII> f;
  FILE *fimpulse;
  float samplingrate;
  int order;
  FILE *in_stack_ffffffffffffef48;
  RBJbase *in_stack_ffffffffffffef50;
  double in_stack_ffffffffffffef58;
  LowPass<8,_Iir::DirectFormII> *in_stack_ffffffffffffef60;
  int local_1094;
  double in_stack_ffffffffffffef78;
  CascadeStages<4,_Iir::DirectFormII> *in_stack_ffffffffffffef80;
  undefined1 local_fc8 [16];
  double in_stack_fffffffffffff048;
  Cascade *in_stack_fffffffffffff050;
  int local_f24;
  undefined1 local_e98 [104];
  double local_e30;
  undefined8 local_e28;
  int local_e1c;
  undefined8 local_e18;
  undefined8 local_e10;
  double local_b30;
  undefined8 local_b28;
  int local_b1c;
  undefined8 local_b18;
  undefined8 local_b10;
  double local_7a8;
  undefined8 local_7a0;
  int local_798;
  undefined4 local_794;
  double local_430;
  undefined8 local_428;
  int local_41c;
  undefined8 local_418;
  undefined8 local_410;
  double local_3b0;
  RBJbase *local_3a8;
  FILE *local_3a0;
  double local_398;
  undefined8 local_390;
  int local_384;
  undefined8 local_380;
  FILE *local_20;
  undefined4 local_18;
  undefined4 local_14;
  int local_4;
  
  local_4 = 0;
  local_14 = 8;
  local_18 = 0x447a0000;
  local_20 = (FILE *)0x0;
  Iir::Butterworth::LowPass<8,_Iir::DirectFormII>::LowPass
            ((LowPass<8,_Iir::DirectFormII> *)0x102526);
  local_380 = 0x4059000000000000;
  dVar1 = 100.0;
  Iir::Butterworth::LowPass<8,_Iir::DirectFormII>::setup
            ((LowPass<8,_Iir::DirectFormII> *)in_stack_ffffffffffffef50,
             (double)in_stack_ffffffffffffef48,5.22787164030936e-318);
  local_20 = fopen("lp.dat","wt");
  for (local_384 = 0; local_384 < 1000; local_384 = local_384 + 1) {
    local_390 = 0;
    if (local_384 == 10) {
      local_390 = 0x3ff0000000000000;
    }
    local_398 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                          (in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
    fprintf(local_20,"%e\n",local_398);
  }
  fclose(local_20);
  local_3a0 = fopen("lpf.dat","wt");
  for (local_3a8 = (RBJbase *)0x0; (double)local_3a8 < 0.5;
      local_3a8 = (RBJbase *)((double)local_3a8 + 0.01)) {
    Iir::Cascade::response(in_stack_fffffffffffff050,in_stack_fffffffffffff048);
    in_stack_ffffffffffffef48 = local_3a0;
    in_stack_ffffffffffffef50 = local_3a8;
    local_3b0 = dVar1;
    dVar1 = std::abs<double>((complex<double> *)local_3a8);
    fprintf(in_stack_ffffffffffffef48,"%e\t%e\n",in_stack_ffffffffffffef50);
  }
  fclose(local_3a0);
  Iir::RBJ::HighPass::HighPass((HighPass *)0x1026f6);
  local_410 = 0x4059000000000000;
  local_418 = 0x4014000000000000;
  Iir::RBJ::HighPass::setup
            ((HighPass *)in_stack_ffffffffffffef60,in_stack_ffffffffffffef58,
             (double)in_stack_ffffffffffffef50,(double)in_stack_ffffffffffffef48);
  local_20 = fopen("hp_rbj.dat","wt");
  for (local_41c = 0; local_41c < 1000; local_41c = local_41c + 1) {
    local_428 = 0;
    if (local_41c == 10) {
      local_428 = 0x3ff0000000000000;
    }
    local_430 = Iir::RBJ::RBJbase::filter<double>
                          (in_stack_ffffffffffffef50,(double)in_stack_ffffffffffffef48);
    fprintf(local_20,"%e\n",local_430);
  }
  fclose(local_20);
  Iir::ChebyshevI::LowPass<8,_Iir::DirectFormII>::LowPass((LowPass<8,_Iir::DirectFormII> *)0x102805)
  ;
  local_794 = 0x3f800000;
  Iir::ChebyshevI::LowPass<8,_Iir::DirectFormII>::setup
            (in_stack_ffffffffffffef60,in_stack_ffffffffffffef58,(double)in_stack_ffffffffffffef50,
             (double)in_stack_ffffffffffffef48);
  local_20 = fopen("lp_cheby1.dat","wt");
  for (local_798 = 0; local_798 < 1000; local_798 = local_798 + 1) {
    local_7a0 = 0;
    if (local_798 == 10) {
      local_7a0 = 0x3ff0000000000000;
    }
    local_7a8 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                          (in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
    fprintf(local_20,"%e\n",local_7a8);
  }
  fclose(local_20);
  Iir::ChebyshevII::HighPass<8,_Iir::DirectFormII>::HighPass
            ((HighPass<8,_Iir::DirectFormII> *)0x102908);
  local_b10 = 0x404e000000000000;
  local_b18 = 0x3fb999999999999a;
  Iir::ChebyshevII::HighPass<8,_Iir::DirectFormII>::setupN
            ((HighPass<8,_Iir::DirectFormII> *)in_stack_ffffffffffffef50,
             (double)in_stack_ffffffffffffef48,5.23287158464527e-318);
  local_20 = fopen("hp_cheby2.dat","wt");
  for (local_b1c = 0; local_b1c < 1000; local_b1c = local_b1c + 1) {
    local_b28 = 0;
    if (local_b1c == 10) {
      local_b28 = 0x3ff0000000000000;
    }
    local_b30 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                          (in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
    fprintf(local_20,"%e\n",local_b30);
  }
  fclose(local_20);
  Iir::Butterworth::BandStop<4,_Iir::DirectFormII>::BandStop
            ((BandStop<4,_Iir::DirectFormII> *)0x102a15);
  local_e10 = 0x3fb999999999999a;
  local_e18 = 0x3f847ae147ae147b;
  Iir::Butterworth::BandStop<4,_Iir::DirectFormII>::setupN
            ((BandStop<4,_Iir::DirectFormII> *)in_stack_ffffffffffffef50,
             (double)in_stack_ffffffffffffef48,5.23419073991967e-318);
  local_20 = fopen("bs_norm.dat","wt");
  for (local_e1c = 0; local_e1c < 1000; local_e1c = local_e1c + 1) {
    local_e28 = 0;
    if (local_e1c == 10) {
      local_e28 = 0x3ff0000000000000;
    }
    local_e30 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                          (in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
    fprintf(local_20,"%e\n",local_e30);
  }
  fclose(local_20);
  memcpy(local_e98,&DAT_0010d110,0x60);
  Iir::Custom::SOSCascade<2,_Iir::DirectFormII>::SOSCascade
            ((SOSCascade<2,_Iir::DirectFormII> *)in_stack_ffffffffffffef50,
             (double (*) [2] [6])in_stack_ffffffffffffef48);
  local_20 = fopen("ellip.dat","wt");
  for (local_f24 = 0; local_f24 < 1000; local_f24 = local_f24 + 1) {
    dVar1 = Iir::CascadeStages<2,_Iir::DirectFormII>::filter<double>
                      ((CascadeStages<2,_Iir::DirectFormII> *)in_stack_ffffffffffffef80,
                       in_stack_ffffffffffffef78);
    fprintf(local_20,"%e\n",dVar1);
  }
  fclose(local_20);
  memcpy(local_fc8,&DAT_0010d170,0x90);
  Iir::Custom::SOSCascade<3,_Iir::DirectFormII>::SOSCascade
            ((SOSCascade<3,_Iir::DirectFormII> *)in_stack_ffffffffffffef50,
             (double (*) [3] [6])in_stack_ffffffffffffef48);
  local_20 = fopen("bessel.dat","wt");
  for (local_1094 = 0; local_1094 < 1000; local_1094 = local_1094 + 1) {
    dVar1 = Iir::CascadeStages<3,_Iir::DirectFormII>::filter<double>
                      ((CascadeStages<3,_Iir::DirectFormII> *)in_stack_ffffffffffffef80,
                       in_stack_ffffffffffffef78);
    fprintf(local_20,"%e\n",dVar1);
  }
  fclose(local_20);
  printf("finished!\n");
  printf("Now run `plot_impulse_fresponse.py` to display the impulse/frequency responses.\n");
  return local_4;
}

Assistant:

int main(int, char**)
{
	const int order = 8;

	// sampling rate here 1kHz as an example
	const float samplingrate = 1000;

	FILE *fimpulse = NULL;

	// Butterworth lowpass
	Iir::Butterworth::LowPass<order> f;
	double cutoff_frequency = 100; // Hz
	f.setup(samplingrate, cutoff_frequency);
	fimpulse = fopen("lp.dat", "wt");
	// let's simulated date streaming in
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = f.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);
	FILE* fresp = fopen("lpf.dat", "wt");
	for(double fr=0.0;fr<0.5;fr=fr+0.01) {
		auto r = f.response(fr);
		fprintf(fresp,"%e\t%e\n",fr,abs(r));
	}
	fclose(fresp);

	// RBJ highpass filter
	// The Q factor determines the resonance at the
	// cutoff frequency. If Q=1/sqrt(2) then the transition
	// has no resonance. The higher the Q-factor the higher
	// the resonance.
	Iir::RBJ::HighPass hp;
	const double hp_cutoff_frequency = 100;
	const double hp_qfactor = 5;
	hp.setup(samplingrate, hp_cutoff_frequency, hp_qfactor);
	fimpulse = fopen("hp_rbj.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = hp.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	Iir::ChebyshevI::LowPass<8> lp_cheby1;
	const float pass_ripple_db2 = 1; // dB
	lp_cheby1.setup(samplingrate,
		cutoff_frequency,
		pass_ripple_db2);
	fimpulse = fopen("lp_cheby1.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = lp_cheby1.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// Demo here if one has a pure digital
	// system one can use normalised
	// frequencies from 0 to 1/2 (Nyquist)
	// where the frequency is 1/samples.
	Iir::ChebyshevII::HighPass<order> hp_cheby2;
	double stop_ripple_dB = 60;
	// Setting cutoff to normalised f=0.1
	double normalised_cutoff_freq = 0.1;
	hp_cheby2.setupN(normalised_cutoff_freq,
		stop_ripple_dB);
	fimpulse = fopen("hp_cheby2.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = hp_cheby2.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// Bandstop filter with default order
	Iir::Butterworth::BandStop<> bsn;
	const double norm_center_frequency = 0.1;
	const double norm_frequency_width = 0.01;
	bsn.setupN(norm_center_frequency, norm_frequency_width);
	fimpulse = fopen("bs_norm.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = bsn.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// generated with: "elliptic_design.py"
	const double coeff[][6] = {
		{1.665623674062209972e-02,
		 -3.924801366970616552e-03,
		 1.665623674062210319e-02,
		 1.000000000000000000e+00,
		 -1.715403014004022175e+00,
		 8.100474793174089472e-01},
		{1.000000000000000000e+00,
		 -1.369778997100624895e+00,
		 1.000000000000000222e+00,
		 1.000000000000000000e+00,
		 -1.605878925999785656e+00,
		 9.538657786383895054e-01}
	};
	const int nSOS = sizeof(coeff) / sizeof(coeff[0]);
	Iir::Custom::SOSCascade<nSOS> cust(coeff);
	fimpulse = fopen("ellip.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = cust.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);



	// generated with: "bessel_design.py"
	const double coeff2[][6] = {
{2.920503346420688542e-04,5.841006692841377084e-04,2.920503346420688542e-04,1.000000000000000000e+00,-1.080977903549440899e+00,2.972760361591921807e-01},
{1.000000000000000000e+00,2.000000000000000000e+00,1.000000000000000000e+00,1.000000000000000000e+00,-1.109677060197390652e+00,3.586665760324884156e-01},
{1.000000000000000000e+00,2.000000000000000000e+00,1.000000000000000000e+00,1.000000000000000000e+00,-1.179438547708672624e+00,5.264979795433866183e-01},
	};
	const int nSOS2 = sizeof(coeff2) / sizeof(coeff2[0]);
	Iir::Custom::SOSCascade<nSOS2> cust2(coeff2);
	fimpulse = fopen("bessel.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = cust2.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);



	printf("finished!\n");
	printf("Now run `plot_impulse_fresponse.py` to display the impulse/frequency responses.\n");
}